

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

uint64_t roaring64_bitmap_rank(roaring64_bitmap_t *r,uint64_t val)

{
  art_val_t *paVar1;
  int iVar2;
  uint64_t uVar3;
  leaf_t *leaf;
  uint8_t high48 [6];
  art_iterator_t it;
  
  high48._0_4_ = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
                 (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  high48._4_2_ = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  art_init_iterator(&it,&r->art,true);
  uVar3 = 0;
  while( true ) {
    paVar1 = it.value;
    if (it.value == (art_val_t *)0x0) {
      return uVar3;
    }
    iVar2 = art_compare_keys(it.key,high48);
    if (-1 < iVar2) break;
    iVar2 = container_get_cardinality(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0]);
    uVar3 = uVar3 + (long)iVar2;
    art_iterator_next(&it);
  }
  if (iVar2 != 0) {
    return uVar3;
  }
  iVar2 = container_rank(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],(uint16_t)val);
  return uVar3 + (long)iVar2;
}

Assistant:

uint64_t roaring64_bitmap_rank(const roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t rank = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            rank += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            return rank +
                   container_rank(leaf->container, leaf->typecode, low16);
        } else {
            return rank;
        }
        art_iterator_next(&it);
    }
    return rank;
}